

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O2

reverse_iterator __thiscall JSONNode::rbegin(JSONNode *this)

{
  JSONNode **ppJVar1;
  JSONNode *in_RSI;
  
  makeUniqueInternal(in_RSI);
  ppJVar1 = internalJSONNode::end(in_RSI->internal);
  this->internal = (internalJSONNode *)(ppJVar1 + -1);
  return (reverse_iterator)(JSONNode **)this;
}

Assistant:

inline JSONNode::reverse_iterator JSONNode::rbegin(void) json_nothrow {
		  JSON_CHECK_INTERNAL();
		  JSON_ASSERT(type() == JSON_NODE || type() == JSON_ARRAY, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("rbegin"));
		  makeUniqueInternal();
		  return JSONNode::reverse_iterator(internal -> end() - 1);
	   }